

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

bool __thiscall
ON_3dPointArray::Create
          (ON_3dPointArray *this,int point_dimension,int bRational,int point_count,int point_stride,
          float *points)

{
  double *pdVar1;
  ON_3dPoint *pOVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  ON_3dPoint local_78;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  
  bVar9 = (point_dimension & 0xfffffffeU) == 2;
  bVar10 = points != (float *)0x0;
  if (point_dimension != 0 || bRational <= point_stride && ((bVar10 && 0 < point_count) && bVar9)) {
    ON_3dPoint::ON_3dPoint(&local_78,0.0,0.0,0.0);
    ON_4dPoint::ON_4dPoint((ON_4dPoint *)local_58,0.0,0.0,0.0,1.0);
    (this->super_ON_SimpleArray<ON_3dPoint>).m_count = 0;
    ON_SimpleArray<ON_3dPoint>::SetCapacity
              (&this->super_ON_SimpleArray<ON_3dPoint>,(long)point_count);
    if ((-1 < point_count) && (point_count <= (this->super_ON_SimpleArray<ON_3dPoint>).m_capacity))
    {
      (this->super_ON_SimpleArray<ON_3dPoint>).m_count = point_count;
    }
    if (bRational == 0) {
      uVar8 = 0;
      uVar7 = (ulong)(uint)point_count;
      if (point_count < 1) {
        uVar7 = uVar8;
      }
      pfVar6 = points + 2;
      for (; uVar7 * 0x18 - uVar8 != 0; uVar8 = uVar8 + 0x18) {
        dVar4 = (double)(float)*(undefined8 *)(pfVar6 + -2);
        dVar5 = (double)(float)((ulong)*(undefined8 *)(pfVar6 + -2) >> 0x20);
        auVar3._8_4_ = SUB84(dVar5,0);
        auVar3._0_8_ = dVar4;
        auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
        if (point_dimension == 3) {
          local_78.z = (double)*pfVar6;
        }
        pOVar2 = (this->super_ON_SimpleArray<ON_3dPoint>).m_a;
        *(double *)((long)&pOVar2->z + uVar8) = local_78.z;
        local_78.y = auVar3._8_8_;
        pdVar1 = (double *)((long)&pOVar2->x + uVar8);
        *pdVar1 = dVar4;
        pdVar1[1] = local_78.y;
        pfVar6 = pfVar6 + point_stride;
      }
    }
    else {
      uVar8 = 0;
      uVar7 = (ulong)(uint)point_count;
      if (point_count < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 * 0x18 - uVar8 != 0; uVar8 = uVar8 + 0x18) {
        dVar4 = (double)(float)((ulong)*(undefined8 *)points >> 0x20);
        local_58._8_4_ = SUB84(dVar4,0);
        local_58._0_8_ = (double)(float)*(undefined8 *)points;
        local_58._12_4_ = (int)((ulong)dVar4 >> 0x20);
        if (point_dimension == 3) {
          local_48 = (double)points[2];
        }
        local_40 = (double)points[point_dimension];
        ON_3dPoint::operator=
                  ((ON_3dPoint *)((long)&((this->super_ON_SimpleArray<ON_3dPoint>).m_a)->x + uVar8),
                   (ON_4dPoint *)local_58);
        points = points + point_stride;
      }
    }
  }
  else {
    ON_SimpleArray<ON_3dPoint>::Destroy(&this->super_ON_SimpleArray<ON_3dPoint>);
  }
  return point_dimension != 0 || bRational <= point_stride && ((bVar10 && 0 < point_count) && bVar9)
  ;
}

Assistant:

bool ON_3dPointArray::Create( 
  int point_dimension,
  int bRational,
  int point_count,
  int point_stride,
  const float* points
  )
{
  bool rc = false;
  if (     point_dimension >= 2 && point_dimension <= 3 
        && point_count>0 && points 
        && point_stride >= bRational?(point_dimension+1):point_dimension )
  {
    rc = true;
    int i;
    ON_3dPoint q(0.0,0.0,0.0);
    ON_4dPoint h(0.0,0.0,0.0,1.0);
    m_count = 0;
    SetCapacity(point_count);
    SetCount(point_count);
    if ( bRational )
    {
      for ( i = 0; i < point_count; i++ )
      {
        h.x = points[0];
        h.y = points[1];
        if ( point_dimension == 3 )
          h.z = points[2];
        h.w = points[point_dimension];
        m_a[i] = h;
        points += point_stride;
      }
    }
    else
    {
      for ( i = 0; i < point_count; i++ )
      {
        q.x = points[0];
        q.y = points[1];
        if ( point_dimension == 3 )
          q.z = points[2];
        m_a[i] = q;
        points += point_stride;
      }
    }
  }
  else
    Destroy();
  return rc;
}